

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::showToolTip
          (QWidgetTextControlPrivate *this,QPoint *globalPos,QPointF *pos,QWidget *contextWidget)

{
  bool bVar1;
  QPointF *in_RDX;
  QRect *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QString toolTip;
  QTextCharFormat *in_stack_ffffffffffffff78;
  int msecDisplayTime;
  QString *in_stack_ffffffffffffffb8;
  QPoint *in_stack_ffffffffffffffc0;
  QTextCursor local_38 [8];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  q_func(in_RDI);
  QWidgetTextControl::cursorForPosition((QWidgetTextControl *)in_RSI,in_RDX);
  msecDisplayTime = (int)((ulong)in_RDX >> 0x20);
  QTextCursor::charFormat();
  QTextCharFormat::toolTip(in_stack_ffffffffffffff78);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x718428);
  QTextCursor::~QTextCursor(local_38);
  bVar1 = QString::isEmpty((QString *)0x71843c);
  if (!bVar1) {
    QRect::QRect(in_RSI);
    QToolTip::showText(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(QWidget *)in_RDI,in_RSI,
                       msecDisplayTime);
  }
  QString::~QString((QString *)0x71849b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::showToolTip(const QPoint &globalPos, const QPointF &pos, QWidget *contextWidget)
{
    const QString toolTip = q_func()->cursorForPosition(pos).charFormat().toolTip();
    if (toolTip.isEmpty())
        return;
    QToolTip::showText(globalPos, toolTip, contextWidget);
}